

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

bool_t ArrayInsert(array *p,size_t Ofs,void *Ptr,size_t Width,size_t Align)

{
  bool_t bVar1;
  bool_t bVar2;
  
  bVar2 = 0;
  bVar1 = ArrayAppend(p,(void *)0x0,Width,Align);
  if (bVar1 != 0) {
    if (p == (array *)0x0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0xcb,"bool_t ArrayInsert(array *, size_t, const void *, size_t, size_t)");
    }
    memmove(p->_Begin + Ofs + Width,p->_Begin + Ofs,(p->_Used - Width) - Ofs);
    bVar2 = 1;
    if (Ptr != (void *)0x0) {
      memcpy(p->_Begin + Ofs,Ptr,Width);
    }
  }
  return bVar2;
}

Assistant:

bool_t ArrayInsert(array* p, size_t Ofs, const void* Ptr, size_t Width, size_t Align)
{
    if (!ArrayAppend(p,NULL,Width,Align))
        return 0;
    memmove(ARRAYBEGIN(*p,uint8_t)+Ofs+Width, ARRAYBEGIN(*p,uint8_t)+Ofs, ArraySize(p)-Width-Ofs);
    if (Ptr)
        memcpy(ARRAYBEGIN(*p,uint8_t)+Ofs, Ptr, Width);
    return 1;
}